

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O2

int __thiscall
jrtplib::RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
AddElement(RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317> *this,
          in6_addr *elem)

{
  HashElement *pHVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  HashElement *pHVar5;
  HashElement **ppHVar6;
  HashElement **ppHVar7;
  
  iVar4 = RTPUDPv6Trans_GetHashIndex_in6_addr::GetIndex(elem);
  if (0x207c < iVar4) {
    return -6;
  }
  ppHVar6 = this->table + iVar4;
  bVar3 = false;
  ppHVar7 = ppHVar6;
  do {
    pHVar1 = *ppHVar7;
    do {
      if ((bVar3 != false) || (pHVar1 == (HashElement *)0x0)) {
        if (bVar3 == false) {
          pHVar5 = (HashElement *)
                   operator_new(0x38,(this->super_RTPMemoryObject).mgr,this->memorytype);
          uVar2 = *(undefined8 *)((long)&elem->__in6_u + 8);
          *(undefined8 *)&(pHVar5->element).__in6_u = *(undefined8 *)&elem->__in6_u;
          *(undefined8 *)((long)&(pHVar5->element).__in6_u + 8) = uVar2;
          pHVar5->listprev = (HashElement *)0x0;
          pHVar5->listnext = (HashElement *)0x0;
          pHVar5->hashprev = (HashElement *)0x0;
          pHVar5->hashnext = (HashElement *)0x0;
          pHVar5->hashindex = iVar4;
          pHVar1 = *ppHVar6;
          *ppHVar6 = pHVar5;
          pHVar5->hashnext = pHVar1;
          if (pHVar1 != (HashElement *)0x0) {
            pHVar1->hashprev = pHVar5;
          }
          if (this->firsthashelem == (HashElement *)0x0) {
            this->firsthashelem = pHVar5;
          }
          else {
            pHVar1 = this->lasthashelem;
            pHVar1->listnext = pHVar5;
            pHVar5->listprev = pHVar1;
          }
          this->lasthashelem = pHVar5;
          return 0;
        }
        return -4;
      }
      bVar3 = operator==(&pHVar1->element,elem);
    } while (bVar3);
    ppHVar7 = &pHVar1->hashnext;
  } while( true );
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::AddElement(const Element &elem)
{
	int index;
	bool found;
	HashElement *e,*newelem;
	
	index = GetIndex::GetIndex(elem);
	if (index >= hashsize)
		return ERR_RTP_HASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	e = table[index];
	found = false;
	while(!found && e != 0)
	{
		if (e->GetElement() == elem)
			found = true;
		else
			e = e->hashnext;
	}
	if (found)
		return ERR_RTP_HASHTABLE_ELEMENTALREADYEXISTS;
	
	// Okay, the key doesn't exist, so we can add the new element in the hash table
	
	newelem = RTPNew(GetMemoryManager(),memorytype) HashElement(elem,index);
	if (newelem == 0)
		return ERR_RTP_OUTOFMEM;

	e = table[index];
	table[index] = newelem;
	newelem->hashnext = e;
	if (e != 0)
		e->hashprev = newelem;
	
	// Now, we still got to add it to the linked list
	
	if (firsthashelem == 0)
	{
		firsthashelem = newelem;
		lasthashelem = newelem;
	}
	else // there already are some elements in the list
	{
		lasthashelem->listnext = newelem;
		newelem->listprev = lasthashelem;
		lasthashelem = newelem;
	}
	return 0;
}